

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drandmea.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double local_60;
  double local_58;
  double local_48;
  undefined8 local_40;
  
  if (argc - 7U < 0xfffffffe) {
    main_cold_4();
    return 1;
  }
  iVar2 = atoi(argv[1]);
  if (iVar2 < 1) {
    main_cold_3();
LAB_001013f2:
    iVar2 = 2;
  }
  else {
    iVar3 = atoi(argv[2]);
    if (argc == 5) {
      if (iVar3 < 1) {
        main_cold_2();
        goto LAB_001013f2;
      }
      local_58 = atof(argv[3]);
      local_60 = atof(argv[4]);
      dVar7 = 0.0;
      local_48 = 0.0;
    }
    else {
      iVar5 = atoi(argv[3]);
      if ((iVar3 < 1) || (iVar5 < 1)) {
        main_cold_1();
        goto LAB_001013f2;
      }
      local_58 = atof(argv[4]);
      local_60 = atof(argv[5]);
      local_48 = (double)iVar3;
      dVar7 = (double)(iVar5 + 1);
    }
    reset_rand();
    local_40 = rand_unified(local_58,local_60);
    if (argc == 6) {
      dVar8 = (double)rand_unified(local_48,dVar7);
      iVar3 = 1;
      if (1 < (int)dVar8) {
        iVar3 = (int)dVar8;
      }
    }
    iVar5 = 0;
    do {
      iVar4 = 0;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      iVar1 = iVar5 + iVar4;
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        printf("%g\n",local_40);
        iVar5 = iVar5 + 1;
        if (iVar2 <= iVar5) goto LAB_001013c2;
      }
      local_40 = rand_unified(local_58,local_60);
      if (argc == 6) {
        dVar8 = (double)rand_unified(local_48,dVar7);
        iVar3 = (int)dVar8;
        if (iVar3 < 2) {
          iVar3 = 1;
        }
      }
      iVar5 = iVar1;
    } while (iVar1 < iVar2);
LAB_001013c2:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 5 && argc != 6)
    {
      fprintf(stderr,
	      "Usage: drandmea Length HalfPeriod MinAmpl MaxAmpl\n"\
	      "   or  drandmea Length MinHalfPer MaxHalfPer MinAmpl MaxAmpl\n"\
	      "DRAND_SAFE=something to avoid the same seed in srand()\n");
      return 1;
    }

  double	fMinAmpl, fMaxAmpl;
  int		nLength, nHalfPeriod, nMinHalfPer, nMaxHalfPer;

  nLength = atoi(argv[1]);
  if(nLength <= 0)
    {
      fprintf(stderr, "Length must be positive\n");
      return 2;
    }

  if(argc == 5)
    {
      nHalfPeriod = atoi(argv[2]);
      if(nHalfPeriod <= 0)
	{
	  fprintf(stderr, "HalfPeriod must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[3]);
      fMaxAmpl = atof(argv[4]);
    }
  else
    {
      nMinHalfPer = atoi(argv[2]);
      nMaxHalfPer = atoi(argv[3]);
      if(nMinHalfPer <= 0 || nMaxHalfPer <= 0)
	{
	  fprintf(stderr, "MinHalfPer and nMaxHalfPer must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[4]);
      fMaxAmpl = atof(argv[5]);
    }

  // See DRAND_SAFE to prevent dependent random series
  reset_rand();

  NaReal	fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
  if(argc == 6)
    {
      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
      if(nHalfPeriod <= 0)
	nHalfPeriod = 1;
    }

  int		i = 0, j = 0;
  while(i < nLength)
    {
      if(j < nHalfPeriod)
	{
	  printf("%g\n", fAmpl);
	  ++j;
	}
      else
	{
	  fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
	  if(argc == 6)
	    {
	      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
	      if(nHalfPeriod <= 0)
		nHalfPeriod = 1;
	    }
	  j = 0;
	  continue;
	}
      ++i;
    }

  return 0;
}